

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

XML_Convert_Result
latin1_toUtf16(ENCODING *UNUSED_enc,char **fromP,char *fromLim,unsigned_short **toP,
              unsigned_short *toLim)

{
  byte bVar1;
  byte *pbVar2;
  ushort *puVar3;
  XML_Convert_Result XVar4;
  
  while( true ) {
    pbVar2 = (byte *)*fromP;
    if ((fromLim <= pbVar2) || (toLim <= *toP)) break;
    *fromP = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    puVar3 = *toP;
    *toP = puVar3 + 1;
    *puVar3 = (ushort)bVar1;
  }
  XVar4 = XML_CONVERT_COMPLETED;
  if (fromLim > pbVar2) {
    XVar4 = (uint)(*toP == toLim) * 2;
  }
  return XVar4;
}

Assistant:

static enum XML_Convert_Result PTRCALL
latin1_toUtf16(const ENCODING *UNUSED_P(enc),
               const char **fromP, const char *fromLim,
               unsigned short **toP, const unsigned short *toLim)
{
  while (*fromP < fromLim && *toP < toLim)
    *(*toP)++ = (unsigned char)*(*fromP)++;

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}